

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O1

optional<Patch::Change> * __thiscall
Patch::get_bounds(optional<Patch::Change> *__return_storage_ptr__,Patch *this)

{
  Point PVar1;
  Node *pNVar2;
  Node *pNVar3;
  Node *pNVar4;
  Point new_end;
  Point old_end;
  Point local_50;
  Point local_48;
  Point local_40;
  Point local_38;
  
  pNVar4 = this->root;
  pNVar2 = pNVar4;
  if (pNVar4 == (Node *)0x0) {
    optional<Patch::Change>::optional(__return_storage_ptr__);
  }
  else {
    do {
      pNVar3 = pNVar2;
      pNVar2 = pNVar3->left;
    } while (pNVar3->left != (Node *)0x0);
    PVar1 = pNVar3->old_distance_from_left_ancestor;
    local_38 = pNVar3->new_distance_from_left_ancestor;
    Point::Point(&local_40);
    Point::Point(&local_48);
    do {
      local_50 = Point::traverse(&pNVar4->old_distance_from_left_ancestor,&pNVar4->old_extent);
      local_40 = Point::traverse(&local_40,&local_50);
      local_50 = Point::traverse(&pNVar4->new_distance_from_left_ancestor,&pNVar4->new_extent);
      local_48 = Point::traverse(&local_48,&local_50);
      pNVar4 = pNVar4->right;
    } while (pNVar4 != (Node *)0x0);
    (__return_storage_ptr__->value).old_start = PVar1;
    (__return_storage_ptr__->value).old_end = local_40;
    (__return_storage_ptr__->value).new_start = local_38;
    (__return_storage_ptr__->value).new_end = local_48;
    (__return_storage_ptr__->value).old_text = (Text *)0x0;
    (__return_storage_ptr__->value).new_text = (Text *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->value).new_text + 4) = 0;
    (__return_storage_ptr__->value).preceding_new_text_size = 0;
    (__return_storage_ptr__->value).old_text_size = 0;
    __return_storage_ptr__->is_some = true;
  }
  return __return_storage_ptr__;
}

Assistant:

optional<Change> Patch::get_bounds() const {
  if (!root) return optional<Change>{};

  Node *node = root;
  while (node->left) {
    node = node->left;
  }

  Point old_start = node->old_distance_from_left_ancestor;
  Point new_start = node->new_distance_from_left_ancestor;

  node = root;
  Point old_end, new_end;
  while (node) {
    old_end = old_end.traverse(node->old_distance_from_left_ancestor.traverse(node->old_extent));
    new_end = new_end.traverse(node->new_distance_from_left_ancestor.traverse(node->new_extent));
    node = node->right;
  }

  return Change{
    old_start, old_end,
    new_start, new_end,
    nullptr, nullptr,
    0, 0, 0
  };
}